

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

bool mkvparser::MasteringMetadata::Parse
               (IMkvReader *reader,longlong mm_start,longlong mm_size,MasteringMetadata **mm)

{
  MasteringMetadata *this;
  pointer pMVar1;
  long lVar2;
  long *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  bool value_parse_status_2;
  PrimaryChromaticity **chromaticity;
  bool is_x;
  longlong value_parse_status_1;
  double value_1;
  longlong value_parse_status;
  double value;
  longlong status;
  longlong child_size;
  longlong child_id;
  longlong read_pos;
  longlong mm_end;
  unique_ptr<mkvparser::MasteringMetadata,_std::default_delete<mkvparser::MasteringMetadata>_>
  mm_ptr;
  pointer in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  longlong *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  longlong in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  IMkvReader *in_stack_ffffffffffffff48;
  undefined1 local_1;
  
  if ((in_RDI == 0) || (*in_RCX != 0)) {
    local_1 = false;
  }
  else {
    this = (MasteringMetadata *)operator_new(0x28);
    MasteringMetadata(this);
    std::unique_ptr<mkvparser::MasteringMetadata,std::default_delete<mkvparser::MasteringMetadata>>
    ::unique_ptr<std::default_delete<mkvparser::MasteringMetadata>,void>
              ((unique_ptr<mkvparser::MasteringMetadata,_std::default_delete<mkvparser::MasteringMetadata>_>
                *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
               in_stack_ffffffffffffff18);
    pMVar1 = std::
             unique_ptr<mkvparser::MasteringMetadata,_std::default_delete<mkvparser::MasteringMetadata>_>
             ::get((unique_ptr<mkvparser::MasteringMetadata,_std::default_delete<mkvparser::MasteringMetadata>_>
                    *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
    if (pMVar1 == (pointer)0x0) {
      local_1 = false;
    }
    else if (in_RSI < in_RSI + in_RDX) {
      lVar2 = ParseElementHeader(in_stack_ffffffffffffff48,
                                 (longlong *)
                                 CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                                 in_stack_ffffffffffffff38,
                                 (longlong *)
                                 CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                                 in_stack_ffffffffffffff28);
      if (lVar2 < 0) {
        local_1 = false;
      }
      else {
        local_1 = false;
      }
    }
    else {
      pMVar1 = std::
               unique_ptr<mkvparser::MasteringMetadata,_std::default_delete<mkvparser::MasteringMetadata>_>
               ::release((unique_ptr<mkvparser::MasteringMetadata,_std::default_delete<mkvparser::MasteringMetadata>_>
                          *)0x195528);
      *in_RCX = (long)pMVar1;
      local_1 = true;
    }
    std::
    unique_ptr<mkvparser::MasteringMetadata,_std::default_delete<mkvparser::MasteringMetadata>_>::
    ~unique_ptr((unique_ptr<mkvparser::MasteringMetadata,_std::default_delete<mkvparser::MasteringMetadata>_>
                 *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
  }
  return local_1;
}

Assistant:

bool MasteringMetadata::Parse(IMkvReader* reader, long long mm_start,
                              long long mm_size, MasteringMetadata** mm) {
  if (!reader || *mm)
    return false;

  std::unique_ptr<MasteringMetadata> mm_ptr(new MasteringMetadata());
  if (!mm_ptr.get())
    return false;

  const long long mm_end = mm_start + mm_size;
  long long read_pos = mm_start;

  while (read_pos < mm_end) {
    long long child_id = 0;
    long long child_size = 0;

    const long long status =
        ParseElementHeader(reader, read_pos, mm_end, child_id, child_size);
    if (status < 0)
      return false;

    if (child_id == libwebm::kMkvLuminanceMax) {
      double value = 0;
      const long long value_parse_status =
          UnserializeFloat(reader, read_pos, child_size, value);
      if (value < -FLT_MAX || value > FLT_MAX ||
          (value > 0.0 && value < FLT_MIN)) {
        return false;
      }
      mm_ptr->luminance_max = static_cast<float>(value);
      if (value_parse_status < 0 || mm_ptr->luminance_max < 0.0 ||
          mm_ptr->luminance_max > 9999.99) {
        return false;
      }
    } else if (child_id == libwebm::kMkvLuminanceMin) {
      double value = 0;
      const long long value_parse_status =
          UnserializeFloat(reader, read_pos, child_size, value);
      if (value < -FLT_MAX || value > FLT_MAX ||
          (value > 0.0 && value < FLT_MIN)) {
        return false;
      }
      mm_ptr->luminance_min = static_cast<float>(value);
      if (value_parse_status < 0 || mm_ptr->luminance_min < 0.0 ||
          mm_ptr->luminance_min > 999.9999) {
        return false;
      }
    } else {
      bool is_x = false;
      PrimaryChromaticity** chromaticity;
      switch (child_id) {
        case libwebm::kMkvPrimaryRChromaticityX:
        case libwebm::kMkvPrimaryRChromaticityY:
          is_x = child_id == libwebm::kMkvPrimaryRChromaticityX;
          chromaticity = &mm_ptr->r;
          break;
        case libwebm::kMkvPrimaryGChromaticityX:
        case libwebm::kMkvPrimaryGChromaticityY:
          is_x = child_id == libwebm::kMkvPrimaryGChromaticityX;
          chromaticity = &mm_ptr->g;
          break;
        case libwebm::kMkvPrimaryBChromaticityX:
        case libwebm::kMkvPrimaryBChromaticityY:
          is_x = child_id == libwebm::kMkvPrimaryBChromaticityX;
          chromaticity = &mm_ptr->b;
          break;
        case libwebm::kMkvWhitePointChromaticityX:
        case libwebm::kMkvWhitePointChromaticityY:
          is_x = child_id == libwebm::kMkvWhitePointChromaticityX;
          chromaticity = &mm_ptr->white_point;
          break;
        default:
          return false;
      }
      const bool value_parse_status = PrimaryChromaticity::Parse(
          reader, read_pos, child_size, is_x, chromaticity);
      if (!value_parse_status)
        return false;
    }

    read_pos += child_size;
    if (read_pos > mm_end)
      return false;
  }

  *mm = mm_ptr.release();
  return true;
}